

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3_db_filename(sqlite3 *db,char *zDbName)

{
  Btree *p;
  undefined8 local_28;
  Btree *pBt;
  char *zDbName_local;
  sqlite3 *db_local;
  
  p = sqlite3DbNameToBtree(db,zDbName);
  if (p == (Btree *)0x0) {
    local_28 = (char *)0x0;
  }
  else {
    local_28 = sqlite3BtreeGetFilename(p);
  }
  return local_28;
}

Assistant:

SQLITE_API const char *sqlite3_db_filename(sqlite3 *db, const char *zDbName){
  Btree *pBt;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
  pBt = sqlite3DbNameToBtree(db, zDbName);
  return pBt ? sqlite3BtreeGetFilename(pBt) : 0;
}